

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::BeginClass(GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_38,&this->namer_,struct_def);
  std::operator+(&bStack_78,"type ",&local_38);
  std::operator+(&local_58,&bStack_78," struct {\n\t");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  return;
}

Assistant:

void BeginClass(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;

    code += "type " + namer_.Type(struct_def) + " struct {\n\t";

    // _ is reserved in flatbuffers field names, so no chance of name
    // conflict:
    code += "_tab ";
    code += struct_def.fixed ? "flatbuffers.Struct" : "flatbuffers.Table";
    code += "\n}\n\n";
  }